

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIImage * __thiscall
irr::gui::CGUIEnvironment::addImage
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id,wchar_t *text,
          bool useAlphaChannel)

{
  CGUIImage *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUIImage *)operator_new(0x188);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIImage::CGUIImage(this_00,&this->super_IGUIEnvironment,parent_00,id,*rectangle);
  if (text != (wchar_t *)0x0) {
    (**(code **)(*(long *)this_00 + 0xa0))(this_00,text);
  }
  if (useAlphaChannel) {
    (**(code **)(*(long *)this_00 + 0x140))(this_00,1);
  }
  IReferenceCounted::drop
            ((IReferenceCounted *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x18)));
  return (IGUIImage *)this_00;
}

Assistant:

IGUIImage *CGUIEnvironment::addImage(const core::rect<s32> &rectangle, IGUIElement *parent, s32 id, const wchar_t *text, bool useAlphaChannel)
{
	IGUIImage *img = new CGUIImage(this, parent ? parent : this,
			id, rectangle);

	if (text)
		img->setText(text);

	if (useAlphaChannel)
		img->setUseAlphaChannel(true);

	img->drop();
	return img;
}